

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O1

void google::protobuf::compiler::java::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  undefined8 uVar4;
  Type TVar5;
  JavaType type;
  mapped_type *pmVar6;
  long *plVar7;
  LogMessage *other;
  size_type *psVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar9;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *pFVar10;
  EnumDescriptor *descriptor_01;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string singular_type;
  key_type local_c8;
  undefined1 local_a8 [56];
  key_type local_70;
  key_type local_50;
  
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"scope","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,(key_type *)local_a8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  pFVar10 = extraout_RDX;
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    pFVar10 = extraout_RDX_00;
  }
  UnderscoresToCamelCase_abi_cxx11_((string *)local_a8,(java *)descriptor,pFVar10);
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_a8);
  descriptor_00 = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    descriptor_00 = extraout_RDX_02;
  }
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    descriptor_00 = extraout_RDX_03;
  }
  ClassName_abi_cxx11_((string *)local_a8,*(java **)(descriptor + 0x38),descriptor_00);
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"containing_type","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_a8);
  iVar9 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_00;
  }
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    iVar9 = extraout_EDX_01;
  }
  SimpleItoa_abi_cxx11_((string *)local_a8,(protobuf *)(ulong)*(uint *)(descriptor + 0x28),iVar9);
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"number","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_a8);
  pFVar10 = extraout_RDX_04;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    pFVar10 = extraout_RDX_05;
  }
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    pFVar10 = extraout_RDX_06;
  }
  FieldConstantName_abi_cxx11_((string *)local_a8,(java *)descriptor,pFVar10);
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"constant_name","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_a8);
  iVar9 = extraout_EDX_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_03;
  }
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    iVar9 = extraout_EDX_04;
  }
  if (descriptor[0x34] == (FieldDescriptor)0x0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x38) + 0x30);
  }
  else if (*(long *)(descriptor + 0x40) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x80);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x40) + 0x70);
  }
  SimpleItoa_abi_cxx11_
            ((string *)local_a8,
             (protobuf *)
             (ulong)(uint)((int)((ulong)((long)descriptor - *plVar7) >> 3) * -0x11111111),iVar9);
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"index","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_a8);
  pFVar10 = extraout_RDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    pFVar10 = extraout_RDX_08;
  }
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
    pFVar10 = extraout_RDX_09;
  }
  if (*(int *)(descriptor + 0x30) == 3) {
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  }
  else {
    DefaultValue_abi_cxx11_((string *)local_a8,(java *)descriptor,pFVar10);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"default","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  TVar5 = GetType(descriptor);
  if (TVar5 - TYPE_DOUBLE < 0x12) {
    pcVar11 = &DAT_0024179c + *(int *)(&DAT_0024179c + (ulong)(TVar5 - TYPE_DOUBLE) * 4);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/java/java_extension.cc"
               ,0x49);
    other = internal::LogMessage::operator<<((LogMessage *)local_a8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_c8,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    pcVar11 = (char *)0x0;
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"type_constant","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,(key_type *)local_a8);
  pcVar3 = (char *)pmVar6->_M_string_length;
  strlen(pcVar11);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar3,(ulong)pcVar11);
  pcVar1 = local_a8 + 0x10;
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  pcVar11 = "false";
  if (*(char *)(*(long *)(descriptor + 0x60) + 0x44) != '\0') {
    pcVar11 = "true";
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"packed","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,(key_type *)local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,(ulong)pcVar11);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"enum_map","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,(key_type *)local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x2410c3);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"prototype","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,(key_type *)local_a8);
  std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x2410c3);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  type = GetJavaType(descriptor);
  local_a8._8_8_ = (char *)0x0;
  local_a8[0x10] = '\0';
  if (type == JAVATYPE_ENUM) {
    local_a8._0_8_ = pcVar1;
    ClassName_abi_cxx11_(&local_c8,*(java **)(descriptor + 0x50),descriptor_01);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_a8._0_8_,(char *)(local_a8._8_8_ + local_a8._0_8_));
    std::__cxx11::string::append((char *)&local_c8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"enum_map","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars_pointer,&local_70);
  }
  else {
    if (type != JAVATYPE_MESSAGE) {
      local_a8._0_8_ = pcVar1;
      pcVar11 = BoxedPrimitiveTypeName(type);
      uVar4 = local_a8._8_8_;
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)local_a8,0,(char *)uVar4,(ulong)pcVar11);
      goto LAB_001a007b;
    }
    local_a8._0_8_ = pcVar1;
    ClassName_abi_cxx11_(&local_c8,*(java **)(descriptor + 0x48),(Descriptor *)descriptor_01);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_a8._0_8_,(char *)(local_a8._8_8_ + local_a8._0_8_));
    std::__cxx11::string::append((char *)&local_c8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"prototype","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars_pointer,&local_70);
  }
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
LAB_001a007b:
  iVar9 = *(int *)(descriptor + 0x30);
  if (iVar9 == 3) {
    std::operator+(&local_70,"java.util.List<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8.field_2._8_8_ = plVar7[3];
      local_c8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar8;
      local_c8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_c8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_a8._0_8_,(char *)(local_a8._8_8_ + local_a8._0_8_));
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"type","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_50);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((iVar9 == 3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"singular_type","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_c8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  return;
}

Assistant:

void InitTemplateVars(const FieldDescriptor* descriptor,
                      const string& scope,
                      map<string, string>* vars_pointer) {
  map<string, string> &vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCase(descriptor);
  vars["containing_type"] = ClassName(descriptor->containing_type());
  vars["number"] = SimpleItoa(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = SimpleItoa(descriptor->index());
  vars["default"] =
      descriptor->is_repeated() ? "" : DefaultValue(descriptor);
  vars["type_constant"] = TypeName(GetType(descriptor));
  vars["packed"] = descriptor->options().packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type = ClassName(descriptor->message_type());
      vars["prototype"] = singular_type + ".getDefaultInstance()";
      break;
    case JAVATYPE_ENUM:
      singular_type = ClassName(descriptor->enum_type());
      vars["enum_map"] = singular_type + ".internalGetValueMap()";
      break;
    default:
      singular_type = BoxedPrimitiveTypeName(java_type);
      break;
  }
  vars["type"] = descriptor->is_repeated() ?
      "java.util.List<" + singular_type + ">" : singular_type;
  vars["singular_type"] = singular_type;
}